

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

int Int_ManProofTraceOne(Int_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  int iVar1;
  lit lVar2;
  uint *puVar3;
  Sto_Cls_t *pSVar4;
  int *piVar5;
  abctime aVar6;
  ulong uVar7;
  long lVar8;
  lit *plVar9;
  abctime aVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint local_44;
  
  aVar6 = Abc_Clock();
  if (p->fProofVerif != 0) {
    uVar13 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar13) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,599,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar13 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  for (uVar7 = 0; uVar7 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff); uVar7 = uVar7 + 1) {
    p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar7 * 4) >> 1] = '\x01';
  }
  if (p->pCnf->nClausesA != 0) {
    puVar3 = p->pInters;
    uVar13 = p->nWords;
    iVar11 = pFinal->Id;
    iVar1 = pConflict->Id;
    for (uVar7 = (ulong)uVar13; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      puVar3[(long)(int)(iVar11 * uVar13) + (uVar7 - 1)] =
           puVar3[(long)(int)(iVar1 * uVar13) + (uVar7 - 1)];
    }
  }
  local_44 = p->pProofNums[pConflict->Id];
  uVar7 = (ulong)(uint)p->nTrailSize;
LAB_0045fd1d:
  uVar18 = uVar7 & 0xffffffff;
  do {
    uVar7 = uVar7 - 1;
    if ((int)uVar18 < 1) {
      if (p->fProofVerif == 0) goto LAB_00460110;
      uVar13 = p->nResLits;
      uVar7 = 0;
      uVar18 = 0;
      if (0 < (int)uVar13) {
        uVar18 = (ulong)uVar13;
      }
      break;
    }
    uVar13 = p->pTrail[uVar7] >> 1;
    if (p->pSeens[(int)uVar13] != '\0') {
      p->pSeens[(int)uVar13] = '\0';
      pSVar4 = p->pReasons[(int)uVar13];
      if (pSVar4 != (Sto_Cls_t *)0x0) goto LAB_0045fd5d;
    }
    uVar18 = (ulong)((int)uVar18 - 1);
  } while( true );
LAB_0045fffb:
  if (uVar7 == uVar18) {
LAB_00460070:
    uVar14 = *(uint *)&pFinal->field_0x1c;
    if (uVar13 == (uVar14 >> 3 & 0xffffff)) {
LAB_00460110:
      aVar10 = Abc_Clock();
      p->timeTrace = p->timeTrace + (aVar10 - aVar6);
      iVar11 = p->Counter;
      piVar5 = p->pProofNums;
      piVar5[pFinal->Id] = iVar11;
      if (piVar5[(long)pFinal->Id + -1] != iVar11) {
        return iVar11;
      }
      __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,0x2f3,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    iVar11 = 0;
    do {
      uVar17 = uVar14 >> 3 & 0xffffff;
      uVar13 = p->nResLits;
      uVar7 = 0;
      if (0 < (int)uVar13) {
        uVar7 = (ulong)uVar13;
      }
LAB_004600ac:
      if ((int)uVar17 <= iVar11) {
        if (uVar13 != uVar17) {
          __assert_fail("p->nResLits == (int)pFinal->nLits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                        ,0x2e7,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
        }
        goto LAB_00460110;
      }
      lVar8 = (long)iVar11;
      uVar18 = 0;
      while (uVar7 != uVar18) {
        piVar5 = p->pResLits + uVar18;
        uVar18 = uVar18 + 1;
        if (*(int *)((long)&pFinal[1].pNext + lVar8 * 4) == *piVar5) goto code_r0x004600d4;
      }
      uVar14 = uVar14 & 0xf8000007 | uVar14 + 0x7fffff8 & 0x7fffff8;
      *(uint *)&pFinal->field_0x1c = uVar14;
      for (; lVar8 < (long)(ulong)(uVar14 >> 3 & 0xffffff); lVar8 = lVar8 + 1) {
        *(undefined4 *)((long)&pFinal[1].pNext + lVar8 * 4) =
             *(undefined4 *)((long)&pFinal[1].pNext + lVar8 * 4 + 4);
        uVar14 = *(uint *)&pFinal->field_0x1c;
      }
    } while( true );
  }
  uVar12 = 0;
  do {
    if ((*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff) == uVar12) {
      printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
      Int_ManPrintClause(p,pConflict);
      Int_ManPrintResolvent(p->pResLits,p->nResLits);
      Int_ManPrintClause(p,pFinal);
      uVar13 = p->nResLits;
      goto LAB_00460070;
    }
    lVar8 = uVar12 * 4;
    uVar12 = uVar12 + 1;
  } while (*(int *)((long)&pFinal[1].pNext + lVar8) != p->pResLits[uVar7]);
  uVar7 = uVar7 + 1;
  goto LAB_0045fffb;
code_r0x004600d4:
  iVar11 = iVar11 + 1;
  goto LAB_004600ac;
LAB_0045fd5d:
  if (p->pTrail[uVar7] != *(int *)&pSVar4[1].pNext) {
    __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x275,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  for (lVar8 = 9; lVar8 - 8U < (ulong)(*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff);
      lVar8 = lVar8 + 1) {
    p->pSeens[*(int *)((long)&pSVar4->pNext + lVar8 * 4) >> 1] = '\x01';
  }
  iVar11 = pSVar4->Id;
  if (p->pProofNums[iVar11] < 1) {
    __assert_fail("Int_ManProofGet(p, pReason) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x27d,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  uVar14 = p->Counter + 1;
  p->Counter = uVar14;
  if (p->fProofWrite != 0) {
    fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)uVar14,(ulong)local_44,
            (ulong)(uint)p->pProofNums[iVar11]);
    uVar14 = p->Counter;
  }
  local_44 = uVar14;
  if (p->pCnf->nClausesA != 0) {
    puVar3 = p->pInters;
    uVar14 = p->nWords;
    uVar18 = (ulong)uVar14;
    lVar8 = (long)(int)(pFinal->Id * uVar14);
    lVar16 = (long)(int)(pSVar4->Id * uVar14);
    if (p->pVarTypes[(int)uVar13] == 1) {
      Int_ManTruthOr(puVar3 + lVar8,puVar3 + lVar16,uVar14);
    }
    else {
      for (; 0 < (int)uVar18; uVar18 = uVar18 - 1) {
        puVar3[lVar8 + (uVar18 - 1)] = puVar3[lVar8 + (uVar18 - 1)] & puVar3[lVar16 + (uVar18 - 1)];
      }
    }
  }
  if (p->fProofVerif != 0) {
    uVar14 = p->nResLits;
    uVar18 = 0;
    if (0 < (int)uVar14) {
      uVar18 = (ulong)uVar14;
    }
    for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
      if (p->pResLits[uVar12] >> 1 == uVar13) {
        uVar18 = uVar12 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar18 == uVar14) {
      printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
             (ulong)(uint)pFinal->Id,(ulong)uVar13);
    }
    plVar9 = p->pResLits;
    uVar14 = plVar9[uVar18];
    if ((*(uint *)&pSVar4[1].pNext ^ uVar14) != 1) {
      printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
             (ulong)(uint)pFinal->Id,(ulong)uVar13);
      plVar9 = p->pResLits;
      uVar14 = plVar9[uVar18];
    }
    if ((int)uVar14 >> 1 != uVar13) {
      __assert_fail("lit_var(p->pResLits[v1]) == Var",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,0x29a,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    iVar11 = p->nResLits + -1;
    p->nResLits = iVar11;
    for (; (long)uVar18 < (long)iVar11; uVar18 = uVar18 + 1) {
      plVar9[uVar18] = plVar9[uVar18 + 1];
      iVar11 = p->nResLits;
    }
    for (uVar18 = 1; uVar18 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff); uVar18 = uVar18 + 1) {
      uVar13 = p->nResLits;
      uVar12 = 0;
      if (0 < (int)uVar13) {
        uVar12 = (ulong)uVar13;
      }
      for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
        if ((*(uint *)((long)&pSVar4[1].pNext + uVar18 * 4) ^ p->pResLits[uVar15]) < 2) {
          uVar12 = uVar15 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar12 == uVar13) {
        if (uVar13 == p->nResLitsAlloc) {
          printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                 (ulong)(uint)pFinal->Id);
          uVar13 = p->nResLits;
        }
        lVar2 = *(lit *)((long)&pSVar4[1].pNext + uVar18 * 4);
        p->nResLits = uVar13 + 1;
        p->pResLits[(int)uVar13] = lVar2;
      }
      else if (p->pResLits[uVar12] != *(int *)((long)&pSVar4[1].pNext + uVar18 * 4)) {
        printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
               ,(ulong)(uint)pFinal->Id);
      }
    }
  }
  goto LAB_0045fd1d;
}

Assistant:

int Int_ManProofTraceOne( Int_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

    if ( p->pCnf->nClausesA )
        Int_ManTruthCopy( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pConflict), p->nWords );

    // follow the trail backwards
    PrevId = Int_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Int_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Int_ManProofGet(p, pReason) );
        PrevId = p->Counter;

        if ( p->pCnf->nClausesA )
        {
            if ( p->pVarTypes[Var] == 1 ) // var of A
                Int_ManTruthOr( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
            else
                Int_ManTruthAnd( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Int_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Int_ManPrintClause( p, pConflict );
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
            Int_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
    if ( p->pCnf->nClausesA )
    {
//        Int_ManPrintInterOne( p, pFinal );
    }
    Int_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
    return p->Counter;
}